

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  int iVar1;
  int code;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar2;
  AutoCloseFd __file;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar3;
  AutoCloseFd result;
  Fault f;
  AutoCloseFd local_68;
  AutoCloseFd local_60;
  Array<char> local_58;
  PathPtr local_40;
  
  local_40.parts.ptr = (String *)path.parts.size_;
  do {
    iVar1 = *(int *)&((path.parts.ptr)->content).ptr;
    PathPtr::toString((String *)&local_58,&local_40,false);
    __file = (AutoCloseFd)((long)"();\n\n" + 5);
    if ((AutoCloseFd)local_58.size_ != (AutoCloseFd)0x0) {
      __file = (AutoCloseFd)local_58.ptr;
    }
    iVar1 = openat(iVar1,(char *)__file,0x80000);
    Array<char>::~Array(&local_58);
    if (-1 < iVar1) goto LAB_002390f9;
    code = _::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code == 0) {
LAB_002390f9:
    local_68.fd = iVar1;
    UnwindDetector::UnwindDetector(&local_68.unwindDetector);
    AutoCloseFd::AutoCloseFd(&local_60,&local_68);
    newDiskReadableFile((kj *)&local_58,&local_60);
    this->fd = (AutoCloseFd)local_58.ptr;
    this[1].fd.fd = (undefined4)local_58.size_;
    this[1].fd.unwindDetector = (UnwindDetector)local_58.size_._4_4_;
    local_58.size_ = 0;
    Own<kj::ReadableFile>::dispose((Own<kj::ReadableFile> *)&local_58);
    AutoCloseFd::~AutoCloseFd(&local_60);
    AutoCloseFd::~AutoCloseFd(&local_68);
    pRVar2 = extraout_RDX_00;
  }
  else if ((code == 0x14) || (code == 2)) {
    this->fd = (AutoCloseFd)0x0;
    this[1].fd.fd = 0;
    this[1].fd.unwindDetector = 0;
    pRVar2 = extraout_RDX;
  }
  else {
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2e9,code,"openat(fd, path, O_RDONLY)","path",&local_40);
    this->fd = (AutoCloseFd)0x0;
    this[1].fd.fd = 0;
    this[1].fd.unwindDetector = 0;
    _::Debug::Fault::~Fault((Fault *)&local_58);
    pRVar2 = extraout_RDX_01;
  }
  MVar3.ptr.ptr = pRVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return nullptr;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }